

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utf8.h
# Opt level: O0

void * utf8cpy(void *dst,void *src)

{
  char *s;
  char *d;
  void *src_local;
  void *dst_local;
  
  s = (char *)src;
  d = (char *)dst;
  while (*s != '\0') {
    *d = *s;
    s = s + 1;
    d = d + 1;
  }
  *d = '\0';
  return dst;
}

Assistant:

void *utf8cpy(void *dst, const void *src) {
  char *d = (char *)dst;
  const char *s = (const char *)src;

  // overwriting anything previously in dst, write byte-by-byte
  // from src
  while ('\0' != *s) {
    *d++ = *s++;
  }

  // append null terminating byte
  *d = '\0';

  return dst;
}